

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::anon_unknown_15::AreOffsetsAndCoefficientsConstant
          (anon_unknown_15 *this,
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          *nodes)

{
  long lVar1;
  long lVar2;
  
  if (this != (anon_unknown_15 *)nodes) {
    do {
      lVar2 = *(long *)this;
      lVar1 = (**(code **)(**(long **)(lVar2 + 0x38) + 0x20))();
      if ((lVar1 == 0) || (lVar2 = (**(code **)(**(long **)(lVar2 + 0x38) + 0x20))(), lVar2 == 0)) {
        return false;
      }
      this = this + 8;
    } while (this != (anon_unknown_15 *)nodes);
  }
  return true;
}

Assistant:

bool AreOffsetsAndCoefficientsConstant(
    const std::vector<SERecurrentNode*>& nodes) {
  for (auto node : nodes) {
    if (!node->GetOffset()->AsSEConstantNode() ||
        !node->GetOffset()->AsSEConstantNode()) {
      return false;
    }
  }
  return true;
}